

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::debugging_internal::ElfMemImage::Init(ElfMemImage *this,void *base)

{
  Elf64_Sym *pEVar1;
  Elf64_Sym *pEVar2;
  Elf64_Phdr *pEVar3;
  Elf64_Phdr *pEVar4;
  Elf64_Sym *pEVar5;
  long lVar6;
  ulong uVar7;
  uint32_t uVar8;
  uint32_t *chain;
  uint32_t i_1;
  uint32_t idx;
  uint32_t *buckets;
  uint32_t nbuckets;
  long value;
  uint32_t *gnu_hash;
  uint32_t *sysv_hash;
  Elf64_Dyn *dynamic_entry;
  ptrdiff_t relocation;
  Elf64_Phdr *program_header;
  Elf64_Phdr *pEStack_30;
  int i;
  Elf64_Phdr *dynamic_program_header;
  int elf_class;
  char *base_as_char;
  void *base_local;
  ElfMemImage *this_local;
  
  this->ehdr_ = (Elf64_Ehdr *)0x0;
  this->dynsym_ = (Elf64_Sym *)0x0;
  this->dynstr_ = (char *)0x0;
  this->versym_ = (Elf64_Versym *)0x0;
  this->verdef_ = (Elf64_Verdef *)0x0;
  this->num_syms_ = 0;
  this->strsize_ = 0;
  this->verdefnum_ = 0;
  this->link_base_ = 0xffffffffffffffff;
  if (base != (void *)0x0) {
    if ((((*base != '\x7f') || (*(char *)((long)base + 1) != 'E')) ||
        (*(char *)((long)base + 2) != 'L')) || (*(char *)((long)base + 3) != 'F')) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/debugging/internal/elf_mem_image.cc"
                    ,0xa5,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
    }
    if (*(char *)((long)base + 4) != '\x02') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/debugging/internal/elf_mem_image.cc"
                    ,0xaa,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
    }
    if (*(char *)((long)base + 5) != '\x01') {
      if (*(char *)((long)base + 5) == '\x02') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/debugging/internal/elf_mem_image.cc"
                      ,0xb7,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
      }
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/debugging/internal/elf_mem_image.cc"
                    ,0xbd,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
    }
    this->ehdr_ = (Elf64_Ehdr *)base;
    pEStack_30 = (Elf64_Phdr *)0x0;
    for (program_header._4_4_ = 0; program_header._4_4_ < (int)(uint)this->ehdr_->e_phnum;
        program_header._4_4_ = program_header._4_4_ + 1) {
      pEVar4 = GetPhdr(this,program_header._4_4_);
      pEVar3 = pEStack_30;
      if (pEVar4->p_type == 1) {
        if (this->link_base_ == 0xffffffffffffffff) {
          this->link_base_ = pEVar4->p_vaddr;
        }
      }
      else {
        pEVar3 = pEVar4;
        if (pEVar4->p_type != 2) {
          pEVar3 = pEStack_30;
        }
      }
      pEStack_30 = pEVar3;
    }
    if ((this->link_base_ == 0xffffffffffffffff) || (pEStack_30 == (Elf64_Phdr *)0x0)) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/debugging/internal/elf_mem_image.cc"
                    ,0xd2,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
    }
    gnu_hash = (uint32_t *)0x0;
    value = 0;
    for (sysv_hash = (uint32_t *)((long)base + (pEStack_30->p_vaddr - this->link_base_));
        *(long *)sysv_hash != 0; sysv_hash = sysv_hash + 4) {
      pEVar5 = (Elf64_Sym *)((long)base + (*(long *)(sysv_hash + 2) - this->link_base_));
      lVar6 = *(long *)sysv_hash;
      pEVar1 = (Elf64_Sym *)value;
      pEVar2 = pEVar5;
      if (lVar6 != 4) {
        pEVar2 = (Elf64_Sym *)gnu_hash;
        if (lVar6 == 5) {
          this->dynstr_ = (char *)pEVar5;
        }
        else if (lVar6 == 6) {
          this->dynsym_ = pEVar5;
        }
        else if (lVar6 == 10) {
          this->strsize_ = *(size_t *)(sysv_hash + 2);
        }
        else {
          pEVar1 = pEVar5;
          if (lVar6 != 0x6ffffef5) {
            if (lVar6 == 0x6ffffff0) {
              this->versym_ = (Elf64_Versym *)pEVar5;
              pEVar1 = (Elf64_Sym *)value;
            }
            else if (lVar6 == 0x6ffffffc) {
              this->verdef_ = (Elf64_Verdef *)pEVar5;
              pEVar1 = (Elf64_Sym *)value;
            }
            else {
              pEVar1 = (Elf64_Sym *)value;
              if (lVar6 == 0x6ffffffd) {
                this->verdefnum_ = *(size_t *)(sysv_hash + 2);
              }
            }
          }
        }
      }
      gnu_hash = &pEVar2->st_name;
      value = (long)pEVar1;
    }
    if (((gnu_hash == (uint32_t *)0x0) && (value == 0)) ||
       ((this->dynsym_ == (Elf64_Sym *)0x0 ||
        ((((this->dynstr_ == (char *)0x0 || (this->versym_ == (Elf64_Versym *)0x0)) ||
          (this->verdef_ == (Elf64_Verdef *)0x0)) ||
         ((this->verdefnum_ == 0 || (this->strsize_ == 0)))))))) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/debugging/internal/elf_mem_image.cc"
                    ,0x100,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
    }
    if (gnu_hash == (uint32_t *)0x0) {
      if (value == 0) {
        __assert_fail("gnu_hash",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/debugging/internal/elf_mem_image.cc"
                      ,0x108,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
      }
      lVar6 = value + 0x10 + (ulong)*(uint *)(value + 8) * 8;
      chain._4_4_ = 0;
      chain._0_4_ = *(uint *)value;
      do {
        if ((uint)chain == 0) break;
        chain._0_4_ = (uint)chain - 1;
        chain._4_4_ = *(uint32_t *)(lVar6 + (ulong)(uint)chain * 4);
      } while (chain._4_4_ == 0);
      if (chain._4_4_ != 0) {
        do {
          uVar8 = chain._4_4_ + 1;
          uVar7 = (ulong)chain._4_4_;
          chain._4_4_ = uVar8;
        } while ((*(uint *)(lVar6 + (ulong)*(uint *)value * 4 + (ulong)*(uint *)(value + 4) * -4 +
                           uVar7 * 4) & 1) == 0);
      }
      this->num_syms_ = chain._4_4_;
    }
    else {
      this->num_syms_ = gnu_hash[1];
    }
  }
  return;
}

Assistant:

void ElfMemImage::Init(const void *base) {
  ehdr_      = nullptr;
  dynsym_    = nullptr;
  dynstr_    = nullptr;
  versym_    = nullptr;
  verdef_    = nullptr;
  num_syms_ = 0;
  strsize_   = 0;
  verdefnum_ = 0;
  // Sentinel: PT_LOAD .p_vaddr can't possibly be this.
  link_base_ = ~ElfW(Addr){0};  // NOLINT(readability/braces)
  if (!base) {
    return;
  }
  const char *const base_as_char = reinterpret_cast<const char *>(base);
  if (base_as_char[EI_MAG0] != ELFMAG0 || base_as_char[EI_MAG1] != ELFMAG1 ||
      base_as_char[EI_MAG2] != ELFMAG2 || base_as_char[EI_MAG3] != ELFMAG3) {
    assert(false);
    return;
  }
  int elf_class = base_as_char[EI_CLASS];
  if (elf_class != kElfClass) {
    assert(false);
    return;
  }
  switch (base_as_char[EI_DATA]) {
    case ELFDATA2LSB: {
#ifndef ABSL_IS_LITTLE_ENDIAN
      assert(false);
      return;
#endif
      break;
    }
    case ELFDATA2MSB: {
#ifndef ABSL_IS_BIG_ENDIAN
      assert(false);
      return;
#endif
      break;
    }
    default: {
      assert(false);
      return;
    }
  }

  ehdr_ = reinterpret_cast<const ElfW(Ehdr) *>(base);
  const ElfW(Phdr) *dynamic_program_header = nullptr;
  for (int i = 0; i < ehdr_->e_phnum; ++i) {
    const ElfW(Phdr) *const program_header = GetPhdr(i);
    switch (program_header->p_type) {
      case PT_LOAD:
        if (!~link_base_) {
          link_base_ = program_header->p_vaddr;
        }
        break;
      case PT_DYNAMIC:
        dynamic_program_header = program_header;
        break;
    }
  }
  if (!~link_base_ || !dynamic_program_header) {
    assert(false);
    // Mark this image as not present. Can not recur infinitely.
    Init(nullptr);
    return;
  }
  ptrdiff_t relocation =
      base_as_char - reinterpret_cast<const char *>(link_base_);
  ElfW(Dyn)* dynamic_entry = reinterpret_cast<ElfW(Dyn)*>(
      static_cast<intptr_t>(dynamic_program_header->p_vaddr) + relocation);
  uint32_t *sysv_hash = nullptr;
  uint32_t *gnu_hash = nullptr;
  for (; dynamic_entry->d_tag != DT_NULL; ++dynamic_entry) {
    const auto value =
        static_cast<intptr_t>(dynamic_entry->d_un.d_val) + relocation;
    switch (dynamic_entry->d_tag) {
      case DT_HASH:
        sysv_hash = reinterpret_cast<uint32_t *>(value);
        break;
      case DT_GNU_HASH:
        gnu_hash = reinterpret_cast<uint32_t *>(value);
        break;
      case DT_SYMTAB:
        dynsym_ = reinterpret_cast<ElfW(Sym) *>(value);
        break;
      case DT_STRTAB:
        dynstr_ = reinterpret_cast<const char *>(value);
        break;
      case DT_VERSYM:
        versym_ = reinterpret_cast<ElfW(Versym) *>(value);
        break;
      case DT_VERDEF:
        verdef_ = reinterpret_cast<ElfW(Verdef) *>(value);
        break;
      case DT_VERDEFNUM:
        verdefnum_ = static_cast<size_t>(dynamic_entry->d_un.d_val);
        break;
      case DT_STRSZ:
        strsize_ = static_cast<size_t>(dynamic_entry->d_un.d_val);
        break;
      default:
        // Unrecognized entries explicitly ignored.
        break;
    }
  }
  if ((!sysv_hash && !gnu_hash) || !dynsym_ || !dynstr_ || !versym_ ||
      !verdef_ || !verdefnum_ || !strsize_) {
    assert(false);  // invalid VDSO
    // Mark this image as not present. Can not recur infinitely.
    Init(nullptr);
    return;
  }
  if (sysv_hash) {
    num_syms_ = sysv_hash[1];
  } else {
    assert(gnu_hash);
    // Compute the number of symbols for DT_GNU_HASH, which is specified by
    // https://sourceware.org/gnu-gabi/program-loading-and-dynamic-linking.txt
    uint32_t nbuckets = gnu_hash[0];
    // The buckets array is located after the header (4 uint32) and the bloom
    // filter (size_t array of gnu_hash[2] elements).
    uint32_t *buckets = gnu_hash + 4 + sizeof(size_t) / 4 * gnu_hash[2];
    // Find the chain of the last non-empty bucket.
    uint32_t idx = 0;
    for (uint32_t i = nbuckets; i > 0;) {
      idx = buckets[--i];
      if (idx != 0) break;
    }
    if (idx != 0) {
      // Find the last element of the chain, which has an odd value.
      // Add one to get the number of symbols.
      uint32_t *chain = buckets + nbuckets - gnu_hash[1];
      while (chain[idx++] % 2 == 0) {
      }
    }
    num_syms_ = idx;
  }
}